

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall
CLI::App::add_option
          (App *this,string *option_name,callback_t *option_callback,string *option_description,
          bool defaulted,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *func)

{
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  __first;
  bool bVar1;
  long lVar2;
  Option *pOVar3;
  char *__lhs;
  pointer pOVar4;
  ulong uVar5;
  undefined8 uVar6;
  string *in_RCX;
  string *in_RSI;
  long in_RDI;
  byte in_R8B;
  string *matchname;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *opt_1;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range1;
  Option_p *option;
  string test_name_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *osn;
  iterator __end4_2;
  iterator __begin4_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4_2;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *opt;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range3_1;
  Option *op_3;
  string test_name_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sname;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  Option *op_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sn;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4_1;
  Option *op_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ln;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  Option *op;
  string test_name;
  Option myopt;
  Option *in_stack_fffffffffffff868;
  Option *in_stack_fffffffffffff870;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *in_stack_fffffffffffff878;
  allocator *paVar7;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *in_stack_fffffffffffff880;
  anon_class_8_1_a852a0a7_for__M_pred in_stack_fffffffffffff888;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  in_stack_fffffffffffff890;
  undefined7 in_stack_fffffffffffff898;
  undefined1 in_stack_fffffffffffff89f;
  string *in_stack_fffffffffffff8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8b0;
  char *in_stack_fffffffffffff8b8;
  string *name;
  Option *in_stack_fffffffffffff8d0;
  undefined7 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f7;
  App *in_stack_fffffffffffff8f8;
  allocator local_681;
  string local_680 [39];
  undefined1 local_659;
  undefined8 in_stack_fffffffffffff9c8;
  undefined1 allow_non_standard;
  App *in_stack_fffffffffffff9d0;
  callback_t *in_stack_fffffffffffff9d8;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  in_stack_fffffffffffff9e0;
  string *in_stack_fffffffffffff9e8;
  undefined7 in_stack_fffffffffffff9f0;
  undefined1 in_stack_fffffffffffff9f7;
  undefined1 uVar8;
  string local_5e8 [32];
  string local_5c8 [32];
  reference local_5a8;
  undefined1 local_599;
  string local_578 [32];
  string local_558;
  reference local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_530;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_528;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_520;
  reference local_518;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_510;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_508;
  long local_500;
  undefined1 local_4f1;
  Option *in_stack_fffffffffffffb10;
  Option *in_stack_fffffffffffffb18;
  string local_4d0 [32];
  Option *local_4b0;
  string local_4a8 [32];
  reference local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_480;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_478;
  undefined1 *local_470;
  undefined1 local_461;
  string local_440 [32];
  App *local_420;
  reference local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_410;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_408;
  undefined1 *local_400;
  undefined1 local_3f1;
  string local_3d0 [32];
  Option *local_3b0;
  reference local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_398;
  undefined1 *local_390;
  undefined1 local_381;
  string local_360 [32];
  Option *local_340;
  string local_338 [32];
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_318;
  undefined1 *local_310;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_308;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_300;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_2f8;
  string local_2c0 [32];
  string local_2a0 [32];
  undefined1 local_280 [40];
  undefined1 auStack_258 [24];
  undefined1 auStack_240 [543];
  byte local_21;
  
  local_21 = in_R8B & 1;
  ::std::__cxx11::string::string(local_2a0,in_RSI);
  ::std::__cxx11::string::string(local_2c0,in_RCX);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  Option::Option((Option *)CONCAT17(in_stack_fffffffffffff9f7,in_stack_fffffffffffff9f0),
                 in_stack_fffffffffffff9e8,(string *)in_stack_fffffffffffff9e0._M_current,
                 in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                 SUB81((ulong)in_stack_fffffffffffff9c8 >> 0x38,0));
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
               *)0x14940e);
  ::std::__cxx11::string::~string(local_2c0);
  ::std::__cxx11::string::~string(local_2a0);
  local_300 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff868);
  local_308 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff868);
  local_310 = local_280;
  __first._M_current._7_1_ = in_stack_fffffffffffff89f;
  __first._M_current._0_7_ = in_stack_fffffffffffff898;
  local_2f8 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::add_option(std::__cxx11::string,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>,std::__cxx11::string,bool,std::function<std::__cxx11::string()>)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (__first,in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  local_318 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                        ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                          *)in_stack_fffffffffffff868);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)in_stack_fffffffffffff870,
                     (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)in_stack_fffffffffffff868);
  if (!bVar1) {
    std::
    vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
    ::begin((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             *)in_stack_fffffffffffff868);
    std::
    vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
    ::end((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           *)in_stack_fffffffffffff868);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                          *)in_stack_fffffffffffff870,
                         (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                          *)in_stack_fffffffffffff868);
      if (!bVar1) {
        uVar6 = __cxa_allocate_exception(0x38);
        paVar7 = &local_681;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_680,"added option matched existing option name",paVar7)
        ;
        OptionAlreadyAdded::OptionAlreadyAdded
                  ((OptionAlreadyAdded *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
        __cxa_throw(uVar6,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
      ::operator*((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                   *)&stack0xfffffffffffff9e0);
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x14a3ac);
      Option::matching_name_abi_cxx11_(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
      ::operator++((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                    *)&stack0xfffffffffffff9e0);
    }
    local_659 = 1;
    uVar6 = __cxa_allocate_exception(0x38);
    ::std::operator+(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
    OptionAlreadyAdded::OptionAlreadyAdded
              ((OptionAlreadyAdded *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    local_659 = 0;
    __cxa_throw(uVar6,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff880);
  if ((bVar1) &&
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff880), bVar1)) {
    Option::get_single_name_abi_cxx11_(in_stack_fffffffffffff868);
    ::std::operator+(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
    lVar2 = ::std::__cxx11::string::size();
    if (lVar2 == 3) {
      ::std::__cxx11::string::erase((ulong)local_338,0);
    }
    ::std::__cxx11::string::string(local_360,local_338);
    pOVar3 = get_option_no_throw(in_stack_fffffffffffff8f8,
                                 (string *)
                                 CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
    ::std::__cxx11::string::~string(local_360);
    local_340 = pOVar3;
    if ((pOVar3 != (Option *)0x0) &&
       (bVar1 = OptionBase<CLI::Option>::get_configurable(&pOVar3->super_OptionBase<CLI::Option>),
       bVar1)) {
      local_381 = 1;
      uVar6 = __cxa_allocate_exception(0x38);
      ::std::operator+(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
      OptionAlreadyAdded::OptionAlreadyAdded
                ((OptionAlreadyAdded *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
      local_381 = 0;
      __cxa_throw(uVar6,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
    }
    ::std::__cxx11::string::~string(local_338);
  }
  else if (*(long *)(in_RDI + 0x308) != 0) {
    local_390 = auStack_240;
    local_398._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff868);
    local_3a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff868);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff870,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff868), bVar1) {
      local_3a8 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_398);
      ::std::__cxx11::string::string(local_3d0,(string *)local_3a8);
      pOVar3 = get_option_no_throw(in_stack_fffffffffffff8f8,
                                   (string *)
                                   CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
      ::std::__cxx11::string::~string(local_3d0);
      local_3b0 = pOVar3;
      if ((pOVar3 != (Option *)0x0) &&
         (bVar1 = OptionBase<CLI::Option>::get_configurable(&pOVar3->super_OptionBase<CLI::Option>),
         bVar1)) {
        local_3f1 = 1;
        uVar6 = __cxa_allocate_exception(0x38);
        ::std::operator+(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
        OptionAlreadyAdded::OptionAlreadyAdded
                  ((OptionAlreadyAdded *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
        local_3f1 = 0;
        __cxa_throw(uVar6,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_398);
    }
    local_400 = auStack_258;
    local_408._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff868);
    local_410 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff868);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff870,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff868), bVar1) {
      local_418 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_408);
      ::std::__cxx11::string::string(local_440,(string *)local_418);
      in_stack_fffffffffffff8f8 =
           (App *)get_option_no_throw(in_stack_fffffffffffff8f8,
                                      (string *)
                                      CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0))
      ;
      ::std::__cxx11::string::~string(local_440);
      local_420 = in_stack_fffffffffffff8f8;
      if ((in_stack_fffffffffffff8f8 != (App *)0x0) &&
         (in_stack_fffffffffffff8f7 =
               OptionBase<CLI::Option>::get_configurable
                         ((OptionBase<CLI::Option> *)in_stack_fffffffffffff8f8),
         (bool)in_stack_fffffffffffff8f7)) {
        local_461 = 1;
        uVar6 = __cxa_allocate_exception(0x38);
        ::std::operator+(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
        OptionAlreadyAdded::OptionAlreadyAdded
                  ((OptionAlreadyAdded *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
        local_461 = 0;
        __cxa_throw(uVar6,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_408);
    }
  }
  allow_non_standard = (undefined1)((ulong)in_stack_fffffffffffff9c8 >> 0x38);
  if ((*(byte *)(in_RDI + 0x2e3) & 1) != 0) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff880);
    allow_non_standard = (undefined1)((ulong)in_stack_fffffffffffff9c8 >> 0x38);
    if (!bVar1) {
      local_470 = auStack_258;
      local_478._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff868);
      local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff868);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff870,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff868), bVar1) {
        local_488 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_478);
        uVar5 = ::std::__cxx11::string::length();
        if (1 < uVar5) {
          ::std::__cxx11::string::string(local_4a8);
          ::std::__cxx11::string::push_back((char)local_4a8);
          ::std::__cxx11::string::front();
          ::std::__cxx11::string::push_back((char)local_4a8);
          ::std::__cxx11::string::string(local_4d0,local_4a8);
          pOVar3 = get_option_no_throw(in_stack_fffffffffffff8f8,
                                       (string *)
                                       CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0)
                                      );
          ::std::__cxx11::string::~string(local_4d0);
          local_4b0 = pOVar3;
          if (pOVar3 != (Option *)0x0) {
            local_4f1 = 1;
            uVar6 = __cxa_allocate_exception(0x38);
            ::std::operator+(in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
            OptionAlreadyAdded::OptionAlreadyAdded
                      ((OptionAlreadyAdded *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
            local_4f1 = 0;
            __cxa_throw(uVar6,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded)
            ;
          }
          ::std::__cxx11::string::~string(local_4a8);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_478);
      }
      local_500 = in_RDI + 0xd8;
      local_508._M_current =
           (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
           std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                    *)in_stack_fffffffffffff868);
      local_510 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  std::
                  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                  ::end((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                         *)in_stack_fffffffffffff868);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                            *)in_stack_fffffffffffff870,
                           (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                            *)in_stack_fffffffffffff868);
        allow_non_standard = (undefined1)((ulong)in_stack_fffffffffffff9c8 >> 0x38);
        if (!bVar1) break;
        local_518 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                    ::operator*(&local_508);
        pOVar4 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x149e57);
        local_520 = &pOVar4->snames_;
        local_528._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff868);
        local_530 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff868);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff870,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffff868), bVar1) {
          local_538 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_528);
          uVar5 = ::std::__cxx11::string::size();
          if (1 < uVar5) {
            name = &local_558;
            ::std::__cxx11::string::string((string *)name);
            ::std::__cxx11::string::front();
            ::std::__cxx11::string::push_back((char)name);
            ::std::__cxx11::string::string(local_578,(string *)&local_558);
            bVar1 = Option::check_sname(in_stack_fffffffffffff8d0,name);
            ::std::__cxx11::string::~string(local_578);
            if (bVar1) {
              local_599 = 1;
              __lhs = (char *)__cxa_allocate_exception(0x38);
              ::std::operator+(__lhs,in_stack_fffffffffffff8b0);
              OptionAlreadyAdded::OptionAlreadyAdded
                        ((OptionAlreadyAdded *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
              local_599 = 0;
              __cxa_throw(__lhs,&OptionAlreadyAdded::typeinfo,
                          OptionAlreadyAdded::~OptionAlreadyAdded);
            }
            ::std::__cxx11::string::~string((string *)&local_558);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_528);
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
        ::operator++(&local_508);
      }
    }
  }
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::emplace_back<>((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                    *)in_stack_fffffffffffff870);
  local_5a8 = std::
              vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ::back((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                      *)in_stack_fffffffffffff870);
  operator_new(0x250);
  uVar8 = 1;
  ::std::__cxx11::string::string(local_5c8,in_RSI);
  ::std::__cxx11::string::string(local_5e8,in_RCX);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(in_stack_fffffffffffff880,in_stack_fffffffffffff878);
  Option::Option((Option *)CONCAT17(uVar8,in_stack_fffffffffffff9f0),in_stack_fffffffffffff9e8,
                 (string *)in_stack_fffffffffffff9e0._M_current,in_stack_fffffffffffff9d8,
                 in_stack_fffffffffffff9d0,(bool)allow_non_standard);
  std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::reset
            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)in_stack_fffffffffffff870
             ,in_stack_fffffffffffff868);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
               *)0x14a18e);
  ::std::__cxx11::string::~string(local_5e8);
  ::std::__cxx11::string::~string(local_5c8);
  std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x14a1b5);
  Option::default_function
            (in_stack_fffffffffffff870,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)in_stack_fffffffffffff868);
  if ((local_21 & 1) != 0) {
    std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
              ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x14a1e2);
    Option::capture_default_str((Option *)in_stack_fffffffffffff890._M_current);
  }
  std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
            ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)in_stack_fffffffffffff870
            );
  OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
            ((OptionBase<CLI::OptionDefaults> *)in_stack_fffffffffffff870,in_stack_fffffffffffff868)
  ;
  if ((local_21 & 1) == 0) {
    pOVar4 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                       ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x14a2cf);
    bVar1 = OptionBase<CLI::Option>::get_always_capture_default
                      (&pOVar4->super_OptionBase<CLI::Option>);
    if (bVar1) {
      std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x14a2f4);
      Option::capture_default_str((Option *)in_stack_fffffffffffff890._M_current);
    }
  }
  pOVar4 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                     ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                      in_stack_fffffffffffff870);
  Option::~Option(in_stack_fffffffffffff870);
  return pOVar4;
}

Assistant:

CLI11_INLINE Option *App::add_option(std::string option_name,
                                     callback_t option_callback,
                                     std::string option_description,
                                     bool defaulted,
                                     std::function<std::string()> func) {
    Option myopt{option_name, option_description, option_callback, this, allow_non_standard_options_};

    if(std::find_if(std::begin(options_), std::end(options_), [&myopt](const Option_p &v) { return *v == myopt; }) ==
       std::end(options_)) {
        if(myopt.lnames_.empty() && myopt.snames_.empty()) {
            // if the option is positional only there is additional potential for ambiguities in config files and needs
            // to be checked
            std::string test_name = "--" + myopt.get_single_name();
            if(test_name.size() == 3) {
                test_name.erase(0, 1);
            }

            auto *op = get_option_no_throw(test_name);
            if(op != nullptr && op->get_configurable()) {
                throw(OptionAlreadyAdded("added option positional name matches existing option: " + test_name));
            }
        } else if(parent_ != nullptr) {
            for(auto &ln : myopt.lnames_) {
                auto *op = parent_->get_option_no_throw(ln);
                if(op != nullptr && op->get_configurable()) {
                    throw(OptionAlreadyAdded("added option matches existing positional option: " + ln));
                }
            }
            for(auto &sn : myopt.snames_) {
                auto *op = parent_->get_option_no_throw(sn);
                if(op != nullptr && op->get_configurable()) {
                    throw(OptionAlreadyAdded("added option matches existing positional option: " + sn));
                }
            }
        }
        if(allow_non_standard_options_ && !myopt.snames_.empty()) {
            for(auto &sname : myopt.snames_) {
                if(sname.length() > 1) {
                    std::string test_name;
                    test_name.push_back('-');
                    test_name.push_back(sname.front());
                    auto *op = get_option_no_throw(test_name);
                    if(op != nullptr) {
                        throw(OptionAlreadyAdded("added option interferes with existing short option: " + sname));
                    }
                }
            }
            for(auto &opt : options_) {
                for(const auto &osn : opt->snames_) {
                    if(osn.size() > 1) {
                        std::string test_name;
                        test_name.push_back(osn.front());
                        if(myopt.check_sname(test_name)) {
                            throw(OptionAlreadyAdded("added option interferes with existing non standard option: " +
                                                     osn));
                        }
                    }
                }
            }
        }
        options_.emplace_back();
        Option_p &option = options_.back();
        option.reset(new Option(option_name, option_description, option_callback, this, allow_non_standard_options_));

        // Set the default string capture function
        option->default_function(func);

        // For compatibility with CLI11 1.7 and before, capture the default string here
        if(defaulted)
            option->capture_default_str();

        // Transfer defaults to the new option
        option_defaults_.copy_to(option.get());

        // Don't bother to capture if we already did
        if(!defaulted && option->get_always_capture_default())
            option->capture_default_str();

        return option.get();
    }
    // we know something matches now find what it is so we can produce more error information
    for(auto &opt : options_) {
        const auto &matchname = opt->matching_name(myopt);
        if(!matchname.empty()) {
            throw(OptionAlreadyAdded("added option matched existing option name: " + matchname));
        }
    }
    // this line should not be reached the above loop should trigger the throw
    throw(OptionAlreadyAdded("added option matched existing option name"));  // LCOV_EXCL_LINE
}